

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::IsClassMethod(Var instance)

{
  bool bVar1;
  JavascriptFunction *pJVar2;
  uint uVar3;
  
  bVar1 = VarIs<Js::JavascriptFunction>(instance);
  uVar3 = 0;
  if (bVar1) {
    pJVar2 = UnsafeVarTo<Js::JavascriptFunction>(instance);
  }
  else {
    pJVar2 = (JavascriptFunction *)0x0;
  }
  if (pJVar2 != (JavascriptFunction *)0x0) {
    uVar3 = ((pJVar2->functionInfo).ptr)->attributes >> 9 & 1;
  }
  return uVar3;
}

Assistant:

BOOL JavascriptOperators::IsClassMethod(Var instance)
    {
        JavascriptFunction * function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        return function && function->GetFunctionInfo()->IsClassMethod();
    }